

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

void __thiscall ON_Mesh::Dump(ON_Mesh *this,ON_TextLog *dump)

{
  ON_MeshParameters *this_00;
  ON_2dPoint *pOVar1;
  ON_SurfaceCurvature *pOVar2;
  ON_MeshFace *pOVar3;
  double dVar4;
  double dVar5;
  ON_SHA1_Hash hash;
  ON_SHA1_Hash hash_00;
  ON_SHA1_Hash hash_01;
  ON_SHA1_Hash hash_02;
  ON_SHA1_Hash hash_03;
  ON_SHA1_Hash hash_04;
  ON_SHA1_Hash hash_05;
  ON_SHA1_Hash hash_06;
  bool bVar6;
  Type TVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  wchar_t *pwVar13;
  ulong uVar14;
  ON_MeshNgon *this_01;
  bool bNewLine;
  bool bNewLine_00;
  bool bNewLine_01;
  bool bNewLine_02;
  bool bNewLine_03;
  bool bNewLine_04;
  bool bNewLine_05;
  bool bNewLine_06;
  char *pcVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ON_TextLogIndent *this_02;
  char *pcVar19;
  ON_3dPoint *pOVar20;
  ON_Mesh *mesh;
  ON_TextLogIndent indent1_2;
  ON_TextLogIndent indent2;
  ON_TextLogIndent indent1;
  ON_3dPoint p;
  ON_TextLogIndent indent1_1;
  ON_SHA1_Hash local_120;
  ON_TextLogIndent local_108;
  ulong local_f8;
  ON_TextLogIndent local_f0;
  ON_3dPoint local_e0;
  undefined1 local_c8 [8];
  double dStack_c0;
  uint *local_b8;
  double dStack_b0;
  ON_Terminator *local_a8;
  ON_ProgressReporter *pOStack_a0;
  double local_98;
  double dStack_90;
  ON__UINT8 local_88 [16];
  ON__UINT32 aOStack_78 [2];
  ON__UINT32 OStack_70;
  ON__UINT32 local_6c;
  ON__UINT32 OStack_68;
  ON__UINT32 aOStack_64 [2];
  ON_SHA1_Hash local_5c;
  double local_48;
  double local_40;
  ON_wString local_38;
  
  uVar10 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  uVar14 = (ulong)(uint)(this->m_F).m_count;
  local_f8 = uVar14;
  if (((int)uVar10 < 1) || (uVar10 != (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count)) {
    bVar6 = false;
    ON_TextLog::Print(dump,"ON_Mesh: vertex count = %d  facet count = %d\n",(ulong)uVar10,uVar14);
    pcVar15 = "false";
  }
  else {
    bVar6 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
    ON_TextLog::Print(dump,"ON_Mesh: vertex count = %d  facet count = %d\n",(ulong)uVar10,uVar14);
    pcVar15 = "false";
    if (bVar6) {
      pcVar15 = "true";
    }
  }
  ON_TextLog::Print(dump,"double precision: %s\n",pcVar15);
  iVar16 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pcVar19 = "false";
  pcVar15 = "false";
  if ((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == iVar16) {
    pcVar15 = "true";
  }
  if (iVar16 < 1) {
    pcVar15 = "false";
  }
  ON_TextLog::Print(dump,"vertex normals:   %s\n",pcVar15);
  iVar16 = (this->m_F).m_count;
  pcVar15 = "false";
  if ((this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == iVar16) {
    pcVar15 = "true";
  }
  if (iVar16 < 1) {
    pcVar15 = "false";
  }
  ON_TextLog::Print(dump,"face normals:     %s\n",pcVar15);
  pcVar15 = "false";
  if ((this->m_Ngon).m_count != 0) {
    pcVar15 = "true";
  }
  if ((this->m_F).m_count < 1) {
    pcVar15 = "false";
  }
  ON_TextLog::Print(dump,"n-gons:           %s\n",pcVar15);
  iVar16 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pcVar15 = "false";
  if ((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == iVar16) {
    pcVar15 = "true";
  }
  if (iVar16 < 1) {
    pcVar15 = "false";
  }
  ON_TextLog::Print(dump,"srf parameters:   %s\n",pcVar15);
  iVar16 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pcVar15 = "false";
  if ((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar16) {
    pcVar15 = "true";
  }
  if (iVar16 < 1) {
    pcVar15 = "false";
  }
  ON_TextLog::Print(dump,"tex coords:       %s\n",pcVar15);
  iVar16 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pcVar15 = "false";
  if ((this->m_K).m_count == iVar16) {
    pcVar15 = "true";
  }
  if (iVar16 < 1) {
    pcVar15 = "false";
  }
  ON_TextLog::Print(dump,"vertex kappa:     %s\n",pcVar15);
  iVar16 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pcVar15 = "false";
  if ((this->m_C).m_count == iVar16) {
    pcVar15 = "true";
  }
  if (iVar16 < 1) {
    pcVar15 = "false";
  }
  ON_TextLog::Print(dump,"vertex colors:    %s\n",pcVar15);
  ON_TextLog::Print(dump,"m_Ctag:\n");
  ON_TextLog::PushIndent(dump);
  ON_MappingTag::Dump(&this->m_Ctag,dump);
  ON_TextLog::PopIndent(dump);
  if (this->m_packed_tex_rotate != false) {
    pcVar19 = "true";
  }
  ON_TextLog::Print(dump,"m_packed_tex_rotate: %s\n",pcVar19);
  dVar4 = ON_Interval::operator[]((ON_Interval *)&this->field_0x270,0);
  local_40 = ON_Interval::operator[]((ON_Interval *)&this->field_0x270,1);
  local_48 = ON_Interval::operator[]((ON_Interval *)&this->field_0x280,0);
  dVar5 = ON_Interval::operator[]((ON_Interval *)&this->field_0x280,1);
  ON_TextLog::Print(dump,"m_packed_tex_domain: (%g,%g)x(%g,%g)\n",SUB84(dVar4,0),local_40,local_48,
                    dVar5);
  dVar4 = ON_Interval::operator[]((ON_Interval *)&this->field_0x240,0);
  local_40 = ON_Interval::operator[]((ON_Interval *)&this->field_0x240,1);
  local_48 = ON_Interval::operator[]((ON_Interval *)&this->field_0x250,0);
  dVar5 = ON_Interval::operator[]((ON_Interval *)&this->field_0x250,1);
  ON_TextLog::Print(dump,"m_srf_domain: (%g,%g)x(%g,%g)\n",SUB84(dVar4,0),local_40,local_48,dVar5);
  ON_TextLog::Print(dump,"m_srf_scale: %g,%g\n",SUB84(this->m_srf_scale[0],0),this->m_srf_scale[0]);
  ON_TextLog::Print(dump,"m_Ttag:\n");
  ON_TextLog::PushIndent(dump);
  ON_MappingTag::Dump(&this->m_Ttag,dump);
  ON_TextLog::PopIndent(dump);
  ON_wString::ON_wString((ON_wString *)&local_f0,L"Memory used: ");
  uVar9 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[8])(this);
  ON_wString::ToMemorySize((ON_wString *)&local_108,(ulong)uVar9);
  ON_wString::operator+((ON_wString *)&local_120,(ON_wString *)&local_f0);
  ON_wString::ON_wString(&local_38,L"\n");
  ON_wString::operator+((ON_wString *)local_c8,(ON_wString *)&local_120);
  ON_TextLog::Print(dump,(ON_wString *)local_c8);
  ON_wString::~ON_wString((ON_wString *)local_c8);
  ON_wString::~ON_wString(&local_38);
  ON_wString::~ON_wString((ON_wString *)&local_120);
  ON_wString::~ON_wString((ON_wString *)&local_108);
  ON_wString::~ON_wString((ON_wString *)&local_f0);
  this_00 = this->m_mesh_parameters;
  if (this_00 == (ON_MeshParameters *)0x0) goto LAB_004f949d;
  ON_String::ON_String((ON_String *)&local_f0);
  TVar7 = ON_MeshParameters::GeometrySettingsType(this_00,true);
  switch(TVar7) {
  case Default:
    ON_String::ON_String((ON_String *)local_c8,"ON_MeshParameters::DefaultMesh");
    ON_String::operator=((ON_String *)&local_f0,(ON_String *)local_c8);
    break;
  case FastRender:
    ON_String::ON_String((ON_String *)local_c8,"ON_MeshParameters::FastRenderMesh");
    ON_String::operator=((ON_String *)&local_f0,(ON_String *)local_c8);
    break;
  case QualityRender:
    ON_String::ON_String((ON_String *)local_c8,"ON_MeshParameters::QualityRenderMesh");
    ON_String::operator=((ON_String *)&local_f0,(ON_String *)local_c8);
    break;
  case DefaultAnalysis:
    ON_String::ON_String((ON_String *)local_c8,"ON_MeshParameters::DefaultAnalysisMesh");
    ON_String::operator=((ON_String *)&local_f0,(ON_String *)local_c8);
    break;
  case FromMeshDensity:
    dVar4 = ON_MeshParameters::MeshDensity(this_00,false);
    ON_String::FormatToString
              (local_c8,SUB84(dVar4,0),"ON_MeshParameters::CreateFromMeshDensity(%g)");
    ON_String::operator=((ON_String *)&local_f0,(ON_String *)local_c8);
    break;
  default:
    ON_String::operator=((ON_String *)&local_f0,&ON_String::EmptyString);
    goto LAB_004f93a5;
  }
  ON_String::~ON_String((ON_String *)local_c8);
LAB_004f93a5:
  ON_TextLog::PrintNewLine(dump);
  bVar8 = ON_String::IsNotEmpty((ON_String *)&local_f0);
  if (bVar8) {
    ON_TextLog::Print(dump,"NURBS, ON_Brep, ON_Extrusion meshing parameters:\n");
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)local_c8,dump);
    pcVar15 = ON_String::operator_cast_to_char_((ON_String *)&local_f0);
    ON_TextLog::Print(dump,"%s\n",pcVar15);
    ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)local_c8);
    ON_TextLog::Print(dump,"SubD meshing parameters:\n");
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&local_120,dump);
    ON_SubDDisplayParameters::DecodeFromUnsignedChar
              ((ON_SubDDisplayParameters *)local_c8,this_00->m_subd_mesh_parameters_as_char);
    ON_SubDDisplayParameters::Dump((ON_SubDDisplayParameters *)local_c8,dump);
    this_02 = (ON_TextLogIndent *)&local_120;
  }
  else {
    ON_TextLog::Print(dump,"Custom meshing parameters:\n");
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)local_c8,dump);
    ON_MeshParameters::Dump(this_00,dump);
    this_02 = (ON_TextLogIndent *)local_c8;
  }
  ON_TextLogIndent::~ON_TextLogIndent(this_02);
  ON_TextLog::PrintNewLine(dump);
  ON_String::~ON_String((ON_String *)&local_f0);
LAB_004f949d:
  ON_TextLogIndent::ON_TextLogIndent(&local_f0,dump);
  ON_TextLog::Print(dump,"%d mesh vertices:\n",
                    (ulong)(uint)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count);
  ON_TextLogIndent::ON_TextLogIndent(&local_108,dump);
  OStack_68 = 0;
  aOStack_64[0] = 0;
  aOStack_64[1] = 0;
  aOStack_78[0] = 0;
  aOStack_78[1] = 0;
  OStack_70 = 0;
  local_6c = 0;
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = '\0';
  local_88[9] = '\0';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  local_88[0xc] = '\0';
  local_88[0xd] = '\0';
  local_88[0xe] = '\0';
  local_88[0xf] = '\0';
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_a8 = (ON_Terminator *)0x0;
  pOStack_a0 = (ON_ProgressReporter *)0x0;
  local_b8 = (uint *)0x0;
  dStack_b0 = 0.0;
  local_c8 = (undefined1  [8])0x0;
  dStack_c0 = 0.0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_5c);
  ON_SHA1_Accumulate3fPointArray((ON_SHA1 *)local_c8,&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  ON_SHA1::Hash(&local_120,(ON_SHA1 *)local_c8);
  hash.m_digest[8] = local_120.m_digest[8];
  hash.m_digest[9] = local_120.m_digest[9];
  hash.m_digest[10] = local_120.m_digest[10];
  hash.m_digest[0xb] = local_120.m_digest[0xb];
  hash.m_digest[0xc] = local_120.m_digest[0xc];
  hash.m_digest[0xd] = local_120.m_digest[0xd];
  hash.m_digest[0xe] = local_120.m_digest[0xe];
  hash.m_digest[0xf] = local_120.m_digest[0xf];
  hash.m_digest[0] = local_120.m_digest[0];
  hash.m_digest[1] = local_120.m_digest[1];
  hash.m_digest[2] = local_120.m_digest[2];
  hash.m_digest[3] = local_120.m_digest[3];
  hash.m_digest[4] = local_120.m_digest[4];
  hash.m_digest[5] = local_120.m_digest[5];
  hash.m_digest[6] = local_120.m_digest[6];
  hash.m_digest[7] = local_120.m_digest[7];
  hash.m_digest[0x10] = local_120.m_digest[0x10];
  hash.m_digest[0x11] = local_120.m_digest[0x11];
  hash.m_digest[0x12] = local_120.m_digest[0x12];
  hash.m_digest[0x13] = local_120.m_digest[0x13];
  Internal_PrintMeshArrayHash(dump,hash,L"m_V array hash",bNewLine);
  if (bVar6 == false) {
    pOVar20 = (ON_3dPoint *)0x0;
  }
  else {
    OStack_68 = 0;
    aOStack_64[0] = 0;
    aOStack_64[1] = 0;
    aOStack_78[0] = 0;
    aOStack_78[1] = 0;
    OStack_70 = 0;
    local_6c = 0;
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_98 = 0.0;
    dStack_90 = 0.0;
    local_a8 = (ON_Terminator *)0x0;
    pOStack_a0 = (ON_ProgressReporter *)0x0;
    local_b8 = (uint *)0x0;
    dStack_b0 = 0.0;
    local_c8 = (undefined1  [8])0x0;
    dStack_c0 = 0.0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_5c);
    ON_SHA1_Accumulate3dPointArray
              ((ON_SHA1 *)local_c8,&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
    ON_SHA1::Hash(&local_120,(ON_SHA1 *)local_c8);
    hash_00.m_digest[8] = local_120.m_digest[8];
    hash_00.m_digest[9] = local_120.m_digest[9];
    hash_00.m_digest[10] = local_120.m_digest[10];
    hash_00.m_digest[0xb] = local_120.m_digest[0xb];
    hash_00.m_digest[0xc] = local_120.m_digest[0xc];
    hash_00.m_digest[0xd] = local_120.m_digest[0xd];
    hash_00.m_digest[0xe] = local_120.m_digest[0xe];
    hash_00.m_digest[0xf] = local_120.m_digest[0xf];
    hash_00.m_digest[0] = local_120.m_digest[0];
    hash_00.m_digest[1] = local_120.m_digest[1];
    hash_00.m_digest[2] = local_120.m_digest[2];
    hash_00.m_digest[3] = local_120.m_digest[3];
    hash_00.m_digest[4] = local_120.m_digest[4];
    hash_00.m_digest[5] = local_120.m_digest[5];
    hash_00.m_digest[6] = local_120.m_digest[6];
    hash_00.m_digest[7] = local_120.m_digest[7];
    hash_00.m_digest[0x10] = local_120.m_digest[0x10];
    hash_00.m_digest[0x11] = local_120.m_digest[0x11];
    hash_00.m_digest[0x12] = local_120.m_digest[0x12];
    hash_00.m_digest[0x13] = local_120.m_digest[0x13];
    Internal_PrintMeshArrayHash(dump,hash_00,L"m_dV array hash",bNewLine_00);
    if ((this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count !=
        (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count) {
      UpdateDoublePrecisionVertices(this);
    }
    pOVar20 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
  }
  if (0 < (int)uVar10) {
    uVar9 = 0;
    do {
      if (uVar9 == 8 && 0x10 < uVar10) {
        ON_TextLog::Print(dump,"...\n");
        uVar9 = uVar10 - 8;
      }
      else {
        ON_3dPoint::operator=
                  (&local_e0,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + (int)uVar9);
        if (pOVar20 == (ON_3dPoint *)0x0) {
          ON_TextLog::Print(dump,"m_V[%d] = (%g,%g,%g)\n",SUB84(local_e0.x,0),local_e0.y,local_e0.z,
                            (ulong)uVar9);
        }
        else {
          ON_TextLog::Print(dump,"m_V[%d] = (%.17g,%.17g,%.17g) D = (%.17g,%.17g,%.17g)\n",
                            SUB84(local_e0.x,0),local_e0.y,local_e0.z,pOVar20[(int)uVar9].x,
                            pOVar20[(int)uVar9].y,pOVar20[(int)uVar9].z,(ulong)uVar9);
        }
      }
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < (int)uVar10);
  }
  ON_TextLogIndent::~ON_TextLogIndent(&local_108);
  iVar16 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if ((0 < iVar16) && ((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == iVar16)) {
    ON_TextLog::Print(dump,"%d mesh vertex normals:\n");
    ON_TextLogIndent::ON_TextLogIndent(&local_108,dump);
    OStack_68 = 0;
    aOStack_64[0] = 0;
    aOStack_64[1] = 0;
    aOStack_78[0] = 0;
    aOStack_78[1] = 0;
    OStack_70 = 0;
    local_6c = 0;
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_98 = 0.0;
    dStack_90 = 0.0;
    local_a8 = (ON_Terminator *)0x0;
    pOStack_a0 = (ON_ProgressReporter *)0x0;
    local_b8 = (uint *)0x0;
    dStack_b0 = 0.0;
    local_c8 = (undefined1  [8])0x0;
    dStack_c0 = 0.0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_5c);
    ON_SHA1_Accumulate3fVectorArray
              ((ON_SHA1 *)local_c8,&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
    ON_SHA1::Hash(&local_120,(ON_SHA1 *)local_c8);
    hash_01.m_digest[8] = local_120.m_digest[8];
    hash_01.m_digest[9] = local_120.m_digest[9];
    hash_01.m_digest[10] = local_120.m_digest[10];
    hash_01.m_digest[0xb] = local_120.m_digest[0xb];
    hash_01.m_digest[0xc] = local_120.m_digest[0xc];
    hash_01.m_digest[0xd] = local_120.m_digest[0xd];
    hash_01.m_digest[0xe] = local_120.m_digest[0xe];
    hash_01.m_digest[0xf] = local_120.m_digest[0xf];
    hash_01.m_digest[0] = local_120.m_digest[0];
    hash_01.m_digest[1] = local_120.m_digest[1];
    hash_01.m_digest[2] = local_120.m_digest[2];
    hash_01.m_digest[3] = local_120.m_digest[3];
    hash_01.m_digest[4] = local_120.m_digest[4];
    hash_01.m_digest[5] = local_120.m_digest[5];
    hash_01.m_digest[6] = local_120.m_digest[6];
    hash_01.m_digest[7] = local_120.m_digest[7];
    hash_01.m_digest[0x10] = local_120.m_digest[0x10];
    hash_01.m_digest[0x11] = local_120.m_digest[0x11];
    hash_01.m_digest[0x12] = local_120.m_digest[0x12];
    hash_01.m_digest[0x13] = local_120.m_digest[0x13];
    Internal_PrintMeshArrayHash(dump,hash_01,L"m_N array hash",bNewLine_01);
    if (0 < (int)uVar10) {
      uVar9 = 0;
      do {
        if (uVar9 == 8 && 0x10 < uVar10) {
          ON_TextLog::Print(dump,"...\n");
          uVar9 = uVar10 - 8;
        }
        else {
          ON_3dPoint::operator=
                    (&local_e0,(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a + (int)uVar9);
          ON_TextLog::Print(dump,"m_N[%d] = (%g,%g,%g)\n",SUB84(local_e0.x,0),local_e0.y,local_e0.z,
                            (ulong)uVar9);
        }
        uVar9 = uVar9 + 1;
      } while ((int)uVar9 < (int)uVar10);
    }
    ON_TextLogIndent::~ON_TextLogIndent(&local_108);
    iVar16 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  }
  if ((0 < iVar16) && ((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar16)) {
    ON_TextLog::Print(dump,"%d mesh vertex texture coordinates:\n");
    ON_TextLogIndent::ON_TextLogIndent(&local_108,dump);
    OStack_68 = 0;
    aOStack_64[0] = 0;
    aOStack_64[1] = 0;
    aOStack_78[0] = 0;
    aOStack_78[1] = 0;
    OStack_70 = 0;
    local_6c = 0;
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_98 = 0.0;
    dStack_90 = 0.0;
    local_a8 = (ON_Terminator *)0x0;
    pOStack_a0 = (ON_ProgressReporter *)0x0;
    local_b8 = (uint *)0x0;
    dStack_b0 = 0.0;
    local_c8 = (undefined1  [8])0x0;
    dStack_c0 = 0.0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_5c);
    ON_SHA1_Accumulate2fPointArray
              ((ON_SHA1 *)local_c8,&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
    ON_SHA1::Hash(&local_120,(ON_SHA1 *)local_c8);
    hash_02.m_digest[8] = local_120.m_digest[8];
    hash_02.m_digest[9] = local_120.m_digest[9];
    hash_02.m_digest[10] = local_120.m_digest[10];
    hash_02.m_digest[0xb] = local_120.m_digest[0xb];
    hash_02.m_digest[0xc] = local_120.m_digest[0xc];
    hash_02.m_digest[0xd] = local_120.m_digest[0xd];
    hash_02.m_digest[0xe] = local_120.m_digest[0xe];
    hash_02.m_digest[0xf] = local_120.m_digest[0xf];
    hash_02.m_digest[0] = local_120.m_digest[0];
    hash_02.m_digest[1] = local_120.m_digest[1];
    hash_02.m_digest[2] = local_120.m_digest[2];
    hash_02.m_digest[3] = local_120.m_digest[3];
    hash_02.m_digest[4] = local_120.m_digest[4];
    hash_02.m_digest[5] = local_120.m_digest[5];
    hash_02.m_digest[6] = local_120.m_digest[6];
    hash_02.m_digest[7] = local_120.m_digest[7];
    hash_02.m_digest[0x10] = local_120.m_digest[0x10];
    hash_02.m_digest[0x11] = local_120.m_digest[0x11];
    hash_02.m_digest[0x12] = local_120.m_digest[0x12];
    hash_02.m_digest[0x13] = local_120.m_digest[0x13];
    Internal_PrintMeshArrayHash(dump,hash_02,L"m_T array hash",bNewLine_02);
    if (0 < (int)uVar10) {
      uVar9 = 0;
      do {
        if (uVar9 == 8 && 0x10 < uVar10) {
          ON_TextLog::Print(dump,"...\n");
          uVar9 = uVar10 - 8;
        }
        else {
          ON_2dPoint::ON_2dPoint
                    ((ON_2dPoint *)local_c8,
                     (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a + (int)uVar9);
          ON_TextLog::Print(dump,"m_T[%d] = (%g,%g)\n",local_c8._0_4_,dStack_c0,(ulong)uVar9);
        }
        uVar9 = uVar9 + 1;
      } while ((int)uVar9 < (int)uVar10);
    }
    ON_TextLogIndent::~ON_TextLogIndent(&local_108);
    iVar16 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  }
  if ((0 < iVar16) && ((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == iVar16)) {
    ON_TextLog::Print(dump,"%d mesh vertex surface parameters:\n");
    ON_TextLogIndent::ON_TextLogIndent(&local_108,dump);
    OStack_68 = 0;
    aOStack_64[0] = 0;
    aOStack_64[1] = 0;
    aOStack_78[0] = 0;
    aOStack_78[1] = 0;
    OStack_70 = 0;
    local_6c = 0;
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_98 = 0.0;
    dStack_90 = 0.0;
    local_a8 = (ON_Terminator *)0x0;
    pOStack_a0 = (ON_ProgressReporter *)0x0;
    local_b8 = (uint *)0x0;
    dStack_b0 = 0.0;
    local_c8 = (undefined1  [8])0x0;
    dStack_c0 = 0.0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_5c);
    ON_SHA1_Accumulate2dPointArray
              ((ON_SHA1 *)local_c8,&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
    ON_SHA1::Hash(&local_120,(ON_SHA1 *)local_c8);
    hash_03.m_digest[8] = local_120.m_digest[8];
    hash_03.m_digest[9] = local_120.m_digest[9];
    hash_03.m_digest[10] = local_120.m_digest[10];
    hash_03.m_digest[0xb] = local_120.m_digest[0xb];
    hash_03.m_digest[0xc] = local_120.m_digest[0xc];
    hash_03.m_digest[0xd] = local_120.m_digest[0xd];
    hash_03.m_digest[0xe] = local_120.m_digest[0xe];
    hash_03.m_digest[0xf] = local_120.m_digest[0xf];
    hash_03.m_digest[0] = local_120.m_digest[0];
    hash_03.m_digest[1] = local_120.m_digest[1];
    hash_03.m_digest[2] = local_120.m_digest[2];
    hash_03.m_digest[3] = local_120.m_digest[3];
    hash_03.m_digest[4] = local_120.m_digest[4];
    hash_03.m_digest[5] = local_120.m_digest[5];
    hash_03.m_digest[6] = local_120.m_digest[6];
    hash_03.m_digest[7] = local_120.m_digest[7];
    hash_03.m_digest[0x10] = local_120.m_digest[0x10];
    hash_03.m_digest[0x11] = local_120.m_digest[0x11];
    hash_03.m_digest[0x12] = local_120.m_digest[0x12];
    hash_03.m_digest[0x13] = local_120.m_digest[0x13];
    Internal_PrintMeshArrayHash(dump,hash_03,L"m_S array hash",bNewLine_03);
    if (0 < (int)uVar10) {
      uVar14 = 0;
      do {
        iVar16 = (int)uVar14;
        if (iVar16 == 8 && 0x10 < uVar10) {
          ON_TextLog::Print(dump,"...\n");
          iVar16 = uVar10 - 8;
        }
        else {
          pOVar1 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
          ON_TextLog::Print(dump,"m_S[%d] = (%g,%g)\n",SUB84(pOVar1[iVar16].x,0),pOVar1[iVar16].y,
                            uVar14);
        }
        uVar14 = (ulong)(iVar16 + 1U);
      } while ((int)(iVar16 + 1U) < (int)uVar10);
    }
    ON_TextLogIndent::~ON_TextLogIndent(&local_108);
    iVar16 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  }
  if ((0 < iVar16) && ((this->m_C).m_count == iVar16)) {
    ON_TextLog::Print(dump,"%d mesh vertex colors:\n");
    ON_TextLogIndent::ON_TextLogIndent(&local_108,dump);
    OStack_68 = 0;
    aOStack_64[0] = 0;
    aOStack_64[1] = 0;
    aOStack_78[0] = 0;
    aOStack_78[1] = 0;
    OStack_70 = 0;
    local_6c = 0;
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_98 = 0.0;
    dStack_90 = 0.0;
    local_a8 = (ON_Terminator *)0x0;
    pOStack_a0 = (ON_ProgressReporter *)0x0;
    local_b8 = (uint *)0x0;
    dStack_b0 = 0.0;
    local_c8 = (undefined1  [8])0x0;
    dStack_c0 = 0.0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_5c);
    ON_SHA1::AccumulateInteger32Array
              ((ON_SHA1 *)local_c8,(long)(this->m_C).m_count,(ON__INT32 *)(this->m_C).m_a);
    ON_SHA1::Hash(&local_120,(ON_SHA1 *)local_c8);
    hash_04.m_digest[8] = local_120.m_digest[8];
    hash_04.m_digest[9] = local_120.m_digest[9];
    hash_04.m_digest[10] = local_120.m_digest[10];
    hash_04.m_digest[0xb] = local_120.m_digest[0xb];
    hash_04.m_digest[0xc] = local_120.m_digest[0xc];
    hash_04.m_digest[0xd] = local_120.m_digest[0xd];
    hash_04.m_digest[0xe] = local_120.m_digest[0xe];
    hash_04.m_digest[0xf] = local_120.m_digest[0xf];
    hash_04.m_digest[0] = local_120.m_digest[0];
    hash_04.m_digest[1] = local_120.m_digest[1];
    hash_04.m_digest[2] = local_120.m_digest[2];
    hash_04.m_digest[3] = local_120.m_digest[3];
    hash_04.m_digest[4] = local_120.m_digest[4];
    hash_04.m_digest[5] = local_120.m_digest[5];
    hash_04.m_digest[6] = local_120.m_digest[6];
    hash_04.m_digest[7] = local_120.m_digest[7];
    hash_04.m_digest[0x10] = local_120.m_digest[0x10];
    hash_04.m_digest[0x11] = local_120.m_digest[0x11];
    hash_04.m_digest[0x12] = local_120.m_digest[0x12];
    hash_04.m_digest[0x13] = local_120.m_digest[0x13];
    Internal_PrintMeshArrayHash(dump,hash_04,L"m_C array hash",bNewLine_04);
    if (0 < (int)uVar10) {
      uVar9 = 0;
      do {
        if (uVar9 == 8 && 0x10 < uVar10) {
          ON_TextLog::Print(dump,"...\n");
          uVar9 = uVar10 - 8;
        }
        else {
          ON_Color::ToString((ON_Color *)local_c8,
                             (char)((long)(int)uVar9 << 2) + (char)(this->m_C).m_a,L'\x0e',false);
          pwVar13 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_c8);
          ON_TextLog::Print(dump,L"m_C[%d] = %s\n",(ulong)uVar9,pwVar13);
          ON_wString::~ON_wString((ON_wString *)local_c8);
        }
        uVar9 = uVar9 + 1;
      } while ((int)uVar9 < (int)uVar10);
    }
    ON_TextLogIndent::~ON_TextLogIndent(&local_108);
    iVar16 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  }
  if ((0 < iVar16) && ((this->m_K).m_count == iVar16)) {
    ON_TextLog::Print(dump,"%d mesh vertex principal curvatures:\n");
    ON_TextLogIndent::ON_TextLogIndent(&local_108,dump);
    OStack_68 = 0;
    aOStack_64[0] = 0;
    aOStack_64[1] = 0;
    aOStack_78[0] = 0;
    aOStack_78[1] = 0;
    OStack_70 = 0;
    local_6c = 0;
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_98 = 0.0;
    dStack_90 = 0.0;
    local_a8 = (ON_Terminator *)0x0;
    pOStack_a0 = (ON_ProgressReporter *)0x0;
    local_b8 = (uint *)0x0;
    dStack_b0 = 0.0;
    local_c8 = (undefined1  [8])0x0;
    dStack_c0 = 0.0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_5c);
    ON_SHA1::AccumulateDoubleArray
              ((ON_SHA1 *)local_c8,(long)(this->m_K).m_count * 2,&((this->m_K).m_a)->k1);
    ON_SHA1::Hash(&local_120,(ON_SHA1 *)local_c8);
    hash_05.m_digest[8] = local_120.m_digest[8];
    hash_05.m_digest[9] = local_120.m_digest[9];
    hash_05.m_digest[10] = local_120.m_digest[10];
    hash_05.m_digest[0xb] = local_120.m_digest[0xb];
    hash_05.m_digest[0xc] = local_120.m_digest[0xc];
    hash_05.m_digest[0xd] = local_120.m_digest[0xd];
    hash_05.m_digest[0xe] = local_120.m_digest[0xe];
    hash_05.m_digest[0xf] = local_120.m_digest[0xf];
    hash_05.m_digest[0] = local_120.m_digest[0];
    hash_05.m_digest[1] = local_120.m_digest[1];
    hash_05.m_digest[2] = local_120.m_digest[2];
    hash_05.m_digest[3] = local_120.m_digest[3];
    hash_05.m_digest[4] = local_120.m_digest[4];
    hash_05.m_digest[5] = local_120.m_digest[5];
    hash_05.m_digest[6] = local_120.m_digest[6];
    hash_05.m_digest[7] = local_120.m_digest[7];
    hash_05.m_digest[0x10] = local_120.m_digest[0x10];
    hash_05.m_digest[0x11] = local_120.m_digest[0x11];
    hash_05.m_digest[0x12] = local_120.m_digest[0x12];
    hash_05.m_digest[0x13] = local_120.m_digest[0x13];
    Internal_PrintMeshArrayHash(dump,hash_05,L"m_K array hash",bNewLine_05);
    if (0 < (int)uVar10) {
      uVar14 = 0;
      do {
        iVar16 = (int)uVar14;
        if (iVar16 == 8 && 0x10 < uVar10) {
          ON_TextLog::Print(dump,"...\n");
          iVar16 = uVar10 - 8;
        }
        else {
          pOVar2 = (this->m_K).m_a;
          ON_TextLog::Print(dump,"m_K[%d] = (%g,%g)\n",SUB84(pOVar2[iVar16].k1,0),pOVar2[iVar16].k2,
                            uVar14);
        }
        uVar14 = (ulong)(iVar16 + 1U);
      } while ((int)(iVar16 + 1U) < (int)uVar10);
    }
    ON_TextLogIndent::~ON_TextLogIndent(&local_108);
  }
  uVar14 = local_f8;
  ON_TextLog::Print(dump,"%d mesh faces:\n",(ulong)(uint)(this->m_F).m_count);
  ON_TextLogIndent::ON_TextLogIndent(&local_108,dump);
  OStack_68 = 0;
  aOStack_64[0] = 0;
  aOStack_64[1] = 0;
  aOStack_78[0] = 0;
  aOStack_78[1] = 0;
  OStack_70 = 0;
  local_6c = 0;
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = '\0';
  local_88[9] = '\0';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  local_88[0xc] = '\0';
  local_88[0xd] = '\0';
  local_88[0xe] = '\0';
  local_88[0xf] = '\0';
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_a8 = (ON_Terminator *)0x0;
  pOStack_a0 = (ON_ProgressReporter *)0x0;
  local_b8 = (uint *)0x0;
  dStack_b0 = 0.0;
  local_c8 = (undefined1  [8])0x0;
  dStack_c0 = 0.0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_5c);
  ON_SHA1::AccumulateInteger32Array
            ((ON_SHA1 *)local_c8,(ulong)(uint)(this->m_F).m_count << 2,((this->m_F).m_a)->vi);
  ON_SHA1::Hash(&local_120,(ON_SHA1 *)local_c8);
  uVar10 = local_120.m_digest._0_4_;
  hash_06.m_digest[8] = local_120.m_digest[8];
  hash_06.m_digest[9] = local_120.m_digest[9];
  hash_06.m_digest[10] = local_120.m_digest[10];
  hash_06.m_digest[0xb] = local_120.m_digest[0xb];
  hash_06.m_digest[0xc] = local_120.m_digest[0xc];
  hash_06.m_digest[0xd] = local_120.m_digest[0xd];
  hash_06.m_digest[0xe] = local_120.m_digest[0xe];
  hash_06.m_digest[0xf] = local_120.m_digest[0xf];
  hash_06.m_digest[0] = local_120.m_digest[0];
  hash_06.m_digest[1] = local_120.m_digest[1];
  hash_06.m_digest[2] = local_120.m_digest[2];
  hash_06.m_digest[3] = local_120.m_digest[3];
  hash_06.m_digest[4] = local_120.m_digest[4];
  hash_06.m_digest[5] = local_120.m_digest[5];
  hash_06.m_digest[6] = local_120.m_digest[6];
  hash_06.m_digest[7] = local_120.m_digest[7];
  hash_06.m_digest[0x10] = local_120.m_digest[0x10];
  hash_06.m_digest[0x11] = local_120.m_digest[0x11];
  hash_06.m_digest[0x12] = local_120.m_digest[0x12];
  hash_06.m_digest[0x13] = local_120.m_digest[0x13];
  Internal_PrintMeshArrayHash(dump,hash_06,L"m_F array hash",bNewLine_06);
  iVar16 = (int)uVar14;
  if (0 < iVar16) {
    uVar18 = 0;
    do {
      iVar17 = (int)uVar18;
      if (iVar17 == 8 && 0x10 < (uint)uVar14) {
        ON_TextLog::Print(dump,"...\n");
        iVar17 = iVar16 + -8;
        uVar11 = uVar10;
      }
      else {
        pOVar3 = (this->m_F).m_a;
        uVar9 = pOVar3[iVar17].vi[2];
        uVar11 = pOVar3[iVar17].vi[3];
        if (uVar9 == uVar11) {
          ON_TextLog::Print(dump,"m_F[%d].vi = (%d,%d,%d)\n",uVar18,
                            (ulong)(uint)pOVar3[iVar17].vi[0],(ulong)(uint)pOVar3[iVar17].vi[1],
                            (ulong)uVar9,uVar10);
          uVar11 = uVar10;
        }
        else {
          ON_TextLog::Print(dump,"m_F[%d].vi = (%d,%d,%d,%d)\n",uVar18,
                            (ulong)(uint)pOVar3[iVar17].vi[0],(ulong)(uint)pOVar3[iVar17].vi[1],
                            (ulong)uVar9,uVar11);
        }
      }
      uVar18 = (ulong)(iVar17 + 1U);
      uVar14 = local_f8;
      uVar10 = uVar11;
    } while ((int)(iVar17 + 1U) < (int)local_f8);
  }
  ON_TextLogIndent::~ON_TextLogIndent(&local_108);
  iVar16 = (this->m_F).m_count;
  if ((0 < iVar16) && ((this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == iVar16)) {
    ON_TextLog::Print(dump,"%d mesh face normals:\n");
    uVar14 = local_f8;
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)local_c8,dump);
    iVar16 = (int)uVar14;
    if (0 < iVar16) {
      uVar18 = 0;
      do {
        iVar17 = (int)uVar18;
        if (iVar17 == 8 && 0x10 < (uint)uVar14) {
          ON_TextLog::Print(dump,"...\n");
          iVar17 = iVar16 + -8;
        }
        else {
          ON_3dPoint::operator=
                    (&local_e0,(this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a + iVar17);
          ON_TextLog::Print(dump,"m_FN[%d] = (%g,%g,%g)\n",SUB84(local_e0.x,0),local_e0.y,local_e0.z
                            ,uVar18);
        }
        uVar18 = (ulong)(iVar17 + 1U);
        uVar14 = local_f8;
      } while ((int)(iVar17 + 1U) < (int)local_f8);
    }
    ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)local_c8);
    iVar16 = (this->m_F).m_count;
  }
  if ((0 < iVar16) && ((this->m_Ngon).m_count != 0)) {
    ON_MeshFaceList::ON_MeshFaceList((ON_MeshFaceList *)local_c8,this);
    uVar10 = NgonCount(this);
    ON_TextLog::Print(dump,"%d mesh n-gons:\n",(ulong)uVar10);
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&local_120,dump);
    if (0 < (int)uVar10) {
      uVar9 = 0;
      do {
        if (uVar9 == 8 && 0x10 < uVar10) {
          ON_TextLog::Print(dump,"...\n");
          uVar9 = uVar10 - 8;
        }
        else {
          this_01 = Ngon(this,uVar9);
          if (this_01 == (ON_MeshNgon *)0x0) {
            ON_TextLog::Print(dump,"Ngon(%d) = null\n",(ulong)uVar9);
          }
          else {
            ON_TextLog::Print(dump,"Ngon(%d): ",(ulong)uVar9);
            ON_MeshNgon::Dump(this_01,dump);
            uVar11 = ON_MeshNgon::BoundaryEdgeCount(this_01,(ON_MeshFaceList *)local_c8);
            uVar12 = ON_MeshNgon::OuterBoundaryEdgeCount(this_01);
            ON_TextLog::Print(dump," boundary counts outer = %d, inner = %d",(ulong)uVar12,
                              (ulong)(uVar11 - uVar12));
            ON_TextLog::Print(dump,"\n");
          }
        }
        uVar9 = uVar9 + 1;
      } while ((int)uVar9 < (int)uVar10);
    }
    ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&local_120);
  }
  ON_TextLogIndent::~ON_TextLogIndent(&local_f0);
  return;
}

Assistant:

void ON_Mesh::Dump( ON_TextLog& dump ) const
{
  const int half_max = 8;

  const int fcount = m_F.Count();
  int i;
  const int vcount = m_V.Count();
  ON_3dPoint p, q;

  bool bDoubles =    vcount > 0 
                  && HasDoublePrecisionVertices()
                  && HasSynchronizedDoubleAndSinglePrecisionVertices();

  dump.Print("ON_Mesh: vertex count = %d  facet count = %d\n", m_V.Count(), m_F.Count() );
  dump.Print("double precision: %s\n",bDoubles?"true":"false");
  dump.Print("vertex normals:   %s\n",HasVertexNormals()?"true":"false");
  dump.Print("face normals:     %s\n",HasFaceNormals()?"true":"false");
  dump.Print("n-gons:           %s\n",HasNgons()?"true":"false");
  dump.Print("srf parameters:   %s\n",HasSurfaceParameters()?"true":"false");
  dump.Print("tex coords:       %s\n",HasTextureCoordinates()?"true":"false");
  dump.Print("vertex kappa:     %s\n",HasPrincipalCurvatures()?"true":"false");
  dump.Print("vertex colors:    %s\n",HasVertexColors()?"true":"false");
  dump.Print("m_Ctag:\n"); dump.PushIndent(); m_Ctag.Dump(dump); dump.PopIndent();
  dump.Print("m_packed_tex_rotate: %s\n",m_packed_tex_rotate?"true":"false");
  dump.Print("m_packed_tex_domain: (%g,%g)x(%g,%g)\n",
             m_packed_tex_domain[0][0],m_packed_tex_domain[0][1],
             m_packed_tex_domain[1][0],m_packed_tex_domain[1][1]);
  dump.Print("m_srf_domain: (%g,%g)x(%g,%g)\n",m_srf_domain[0][0],m_srf_domain[0][1],m_srf_domain[1][0],m_srf_domain[1][1]);
  dump.Print("m_srf_scale: %g,%g\n",m_srf_scale[0],m_srf_scale[0]);
  dump.Print("m_Ttag:\n"); dump.PushIndent(); m_Ttag.Dump(dump); dump.PopIndent();
  dump.Print( ON_wString(L"Memory used: ")  + ON_wString::ToMemorySize(this->SizeOf()) + ON_wString(L"\n") );


  const ON_MeshParameters* mp = this->MeshParameters();
  if (nullptr != mp)
  {
    ON_String description;
    switch (mp->GeometrySettingsType(true))
    {
    case ON_MeshParameters::Type::Unset:
      description = ON_String::EmptyString;
      break;
    case ON_MeshParameters::Type::Default:
      description = ON_String("ON_MeshParameters::DefaultMesh");
      break;
    case ON_MeshParameters::Type::FastRender:
      description = ON_String("ON_MeshParameters::FastRenderMesh");
      break;
    case ON_MeshParameters::Type::QualityRender:
      description = ON_String("ON_MeshParameters::QualityRenderMesh");
      break;
    case ON_MeshParameters::Type::DefaultAnalysis:
      description = ON_String("ON_MeshParameters::DefaultAnalysisMesh");
      break;
    case ON_MeshParameters::Type::FromMeshDensity:
      description = ON_String::FormatToString("ON_MeshParameters::CreateFromMeshDensity(%g)", mp->MeshDensity());
      break;
    case ON_MeshParameters::Type::Custom:
      description = ON_String::EmptyString;
      break;
    default:
      description = ON_String::EmptyString;
      break;
    }

    dump.PrintNewLine();
    if (description.IsNotEmpty())
    {
      dump.Print("NURBS, ON_Brep, ON_Extrusion meshing parameters:\n");
      {
        const ON_TextLogIndent indent1(dump);
        dump.Print("%s\n", static_cast<const char*>(description));
      }
      dump.Print("SubD meshing parameters:\n");
      {
        const ON_TextLogIndent indent1(dump);
        const ON_SubDDisplayParameters subdmp = mp->SubDDisplayParameters();
        subdmp.Dump(dump);
      }
    }
    else
    {
      dump.Print("Custom meshing parameters:\n");
      const ON_TextLogIndent indent1(dump);
      mp->Dump(dump);
    }
    dump.PrintNewLine();
  }

  const ON_TextLogIndent indent1(dump);

  dump.Print("%d mesh vertices:\n",m_V.Count());
  {
    const ON_TextLogIndent indent2(dump);
    Internal_PrintMeshArrayHash(dump, m_V, L"m_V array hash", true);
    const ON_3dPoint* D = 0;
    if ( bDoubles )
    {
      Internal_PrintMeshArrayHash(dump, m_dV, L"m_dV array hash", true);
      D = DoublePrecisionVertices().Array();
    }
    for (i = 0; i < vcount; i++)
    {
      if ( i == half_max && 2*half_max < vcount )
      {
        dump.Print("...\n");
        i = vcount-half_max;
      }
      else
      {
        p = m_V[i];
        if ( 0 != D )
        {
          q = D[i];
          dump.Print("m_V[%d] = (%.17g,%.17g,%.17g) D = (%.17g,%.17g,%.17g)\n",
                     i,
                     p.x,p.y,p.z,
                     q.x,q.y,q.z
                     );
        }
        else
        {
          dump.Print("m_V[%d] = (%g,%g,%g)\n",i,p.x,p.y,p.z);
        }
      }
    }
  }

  if ( HasVertexNormals() )
  {
    dump.Print("%d mesh vertex normals:\n",m_N.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_N, L"m_N array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if ( i == half_max && 2*half_max < vcount )
        {
          dump.Print("...\n");
          i = vcount-half_max;
        }
        else
        {
          p = m_N[i];
          dump.Print("m_N[%d] = (%g,%g,%g)\n",i,p.x,p.y,p.z);
        }
      }
    }
  }

  if ( HasTextureCoordinates() )
  {
    dump.Print("%d mesh vertex texture coordinates:\n",m_T.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_T, L"m_T array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if ( i == half_max && 2*half_max < vcount )
        {
          dump.Print("...\n");
          i = vcount-half_max;
        }
        else
        {
          const ON_2dPoint tp(m_T[i]);
          dump.Print("m_T[%d] = (%g,%g)\n",i,tp.x,tp.y);
        }
      }
    }
  }

  if ( HasSurfaceParameters() )
  {
    dump.Print("%d mesh vertex surface parameters:\n",m_S.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_S, L"m_S array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if ( i == half_max && 2*half_max < vcount )
        {
          dump.Print("...\n");
          i = vcount-half_max;
        }
        else
        {
          const ON_2dPoint srfuv = m_S[i];
          dump.Print("m_S[%d] = (%g,%g)\n",i, srfuv.x, srfuv.y);
        }
      }
    }
  }

  if (this->HasVertexColors())
  {
    dump.Print("%d mesh vertex colors:\n", m_C.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_C, L"m_C array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if (i == half_max && 2 * half_max < vcount)
        {
          dump.Print("...\n");
          i = vcount - half_max;
        }
        else
        {
          const ON_wString s = m_C[i].ToString(ON_Color::TextFormat::HashRGBa, 0, true);
          dump.Print(L"m_C[%d] = %s\n", i, static_cast<const wchar_t*>(s));
        }
      }
    }
  }


  if (this->HasPrincipalCurvatures())
  {
    dump.Print("%d mesh vertex principal curvatures:\n", m_K.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_K, L"m_K array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if (i == half_max && 2 * half_max < vcount)
        {
          dump.Print("...\n");
          i = vcount - half_max;
        }
        else
        {
          const ON_SurfaceCurvature k = m_K[i];
          dump.Print("m_K[%d] = (%g,%g)\n", i, k.k1, k.k2);
        }
      }
    }
  }


  dump.Print("%d mesh faces:\n",m_F.Count());
  {
    const ON_TextLogIndent indent2(dump);
    Internal_PrintMeshArrayHash(dump, m_F, L"m_F array hash", true);
    for (i = 0; i < fcount; i++)
    {
      if ( i == half_max && 2*half_max < fcount )
      {
        dump.Print("...\n");
        i = fcount-half_max;
      }
      else if ( m_F[i].vi[2] == m_F[i].vi[3] )
        dump.Print("m_F[%d].vi = (%d,%d,%d)\n",i,m_F[i].vi[0],m_F[i].vi[1],m_F[i].vi[2]);
      else
        dump.Print("m_F[%d].vi = (%d,%d,%d,%d)\n",i,m_F[i].vi[0],m_F[i].vi[1],m_F[i].vi[2],m_F[i].vi[3]);
    }
  }

  if ( HasFaceNormals() )
  {
    dump.Print("%d mesh face normals:\n",m_FN.Count());
    {
      const ON_TextLogIndent indent2(dump);
      for (i = 0; i < fcount; i++)
      {
        if ( i == half_max && 2*half_max < fcount )
        {
          dump.Print("...\n");
          i = fcount-half_max;
        }
        else
        {
          p = m_FN[i];
          dump.Print("m_FN[%d] = (%g,%g,%g)\n",i,p.x,p.y,p.z);
        }
      }
    }
  }

  if ( HasNgons() )
  {
    const ON_MeshFaceList mesh_face_list(this);

    const int ngon_count = NgonCount();
    dump.Print("%d mesh n-gons:\n",ngon_count);
    {
      const ON_TextLogIndent indent2(dump);
      for (i = 0; i < ngon_count; i++)
      {
        if ( i == half_max && 2*half_max < ngon_count )
        {
          dump.Print("...\n");
          i = ngon_count-half_max;
        }
        else
        {
          const ON_MeshNgon* ngon = Ngon(i);
          if ( 0 == ngon )
            dump.Print("Ngon(%d) = null\n",i);
          else
          {
            dump.Print("Ngon(%d): ",i);
            ngon->Dump(dump);
            const int bcount = (int)ngon->BoundaryEdgeCount(mesh_face_list);
            const int outer_boundary_count = (int)ngon->OuterBoundaryEdgeCount();
            const int inner_boundary_count = bcount - outer_boundary_count;
            dump.Print(" boundary counts outer = %d, inner = %d", outer_boundary_count, inner_boundary_count);
            dump.Print("\n");
          }
        }
      }
    }
  }
}